

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_VerilogSimpleWrite(Acb_Ntk_t *p,char *pFileName)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  FILE *__stream;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  pcVar7 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  fprintf(__stream,"\nmodule %s (\n  ",pcVar7);
  uVar6 = (p->vCis).nSize;
  uVar8 = (ulong)uVar6;
  if (p->nRegs < (int)uVar6) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039380f;
      iVar3 = (p->vCis).pArray[lVar12];
      if ((long)iVar3 < 1) goto LAB_0039384d;
      iVar4 = (p->vObjName).nSize;
      if (iVar4 < 1) goto LAB_0039382e;
      if (iVar4 <= iVar3) goto LAB_0039380f;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar3]);
      fprintf(__stream,"%s, ",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCis).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fwrite("\n  ",3,1,__stream);
  uVar6 = (p->vCos).nSize;
  uVar8 = (ulong)uVar6;
  if (p->nRegs < (int)uVar6) {
    lVar12 = 0;
    pcVar7 = "T = %d\t\t";
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039380f;
      iVar3 = (p->vCos).pArray[lVar12];
      if ((long)iVar3 < 1) goto LAB_0039384d;
      iVar4 = (p->vObjName).nSize;
      if (iVar4 < 1) goto LAB_0039382e;
      if (iVar4 <= iVar3) goto LAB_0039380f;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar3]);
      fprintf(__stream,"%s%s",pcVar7 + 8,pcVar9);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCos).nSize;
      pcVar7 = "    \"%s\", ";
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fwrite("\n);\n\n",5,1,__stream);
  uVar6 = (p->vCis).nSize;
  uVar8 = (ulong)uVar6;
  if (p->nRegs < (int)uVar6) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039380f;
      iVar3 = (p->vCis).pArray[lVar12];
      if ((long)iVar3 < 1) goto LAB_0039384d;
      iVar4 = (p->vObjName).nSize;
      if (iVar4 < 1) goto LAB_0039382e;
      if (iVar4 <= iVar3) goto LAB_0039380f;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar3]);
      fprintf(__stream,"  input %s;\n",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCis).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fputc(10,__stream);
  uVar6 = (p->vCos).nSize;
  uVar8 = (ulong)uVar6;
  if (p->nRegs < (int)uVar6) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039380f;
      iVar3 = (p->vCos).pArray[lVar12];
      if ((long)iVar3 < 1) {
LAB_0039384d:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar4 = (p->vObjName).nSize;
      if (iVar4 < 1) goto LAB_0039382e;
      if (iVar4 <= iVar3) goto LAB_0039380f;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar3]);
      fprintf(__stream,"  output %s;\n",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCos).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fputc(10,__stream);
  if (1 < (p->vObjType).nSize) {
    uVar8 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar8) goto LAB_0039386c;
      uVar6 = (uint)(byte)(p->vObjType).pArray[uVar8];
      if ((4 < uVar6) || ((0x19U >> (uVar6 & 0x1f) & 1) == 0)) {
        if ((long)(p->vObjFans).nSize <= (long)uVar8) goto LAB_0039380f;
        iVar3 = (p->vObjFans).pArray[uVar8];
        if (((long)iVar3 < 0) || ((p->vFanSto).nSize <= iVar3)) goto LAB_0039388b;
        if (0 < (p->vFanSto).pArray[iVar3]) {
          uVar10 = (ulong)(p->vObjName).nSize;
          if ((long)uVar10 < 1) goto LAB_0039382e;
          if (uVar10 <= uVar8) goto LAB_0039380f;
          pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar8]);
          fprintf(__stream,"  wire %s;\n",pcVar7);
        }
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)(p->vObjType).nSize);
  }
  fputc(10,__stream);
  if (1 < (p->vObjType).nSize) {
    uVar8 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar8) {
LAB_0039386c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[uVar8];
      if ((4 < bVar1) || ((0x19U >> (bVar1 & 0x1f) & 1) == 0)) {
        if ((long)(p->vObjFans).nSize <= (long)uVar8) {
LAB_0039380f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = (p->vObjFans).pArray[uVar8];
        if (((long)iVar3 < 0) || ((p->vFanSto).nSize <= iVar3)) {
LAB_0039388b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if ((p->vFanSto).pArray[iVar3] < 1) {
          if (1 < bVar1 - 7) {
            __assert_fail("Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                          ,0x1cc,"void Acb_VerilogSimpleWrite(Acb_Ntk_t *, char *)");
          }
          fprintf(__stream,"  %s (","buf");
          if ((long)(p->vObjType).nSize <= (long)uVar8) goto LAB_0039386c;
          cVar2 = (p->vObjType).pArray[uVar8];
          if (cVar2 == '\t') {
            fwrite(" 1\'bx",5,1,__stream);
          }
          else {
            fprintf(__stream," 1\'b%d",(ulong)(cVar2 == '\b'));
          }
          fwrite(" );\n",4,1,__stream);
        }
        else {
          lVar12 = ftell(__stream);
          if ((long)(p->vObjType).nSize <= (long)uVar8) goto LAB_0039386c;
          cVar2 = (p->vObjType).pArray[uVar8];
          pcVar7 = "const0";
          switch(cVar2) {
          case '\a':
            break;
          case '\b':
            pcVar7 = "const1";
            break;
          case '\t':
            pcVar7 = "constX";
            break;
          case '\n':
          case '\x13':
          case '\x14':
switchD_0039350c_caseD_a:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                          ,0x6d,"char *Acb_Oper2Name(int)");
          case '\v':
            pcVar7 = "buf";
            break;
          case '\f':
            pcVar7 = "not";
            break;
          case '\r':
            pcVar7 = "and";
            break;
          case '\x0e':
            pcVar7 = "nand";
            break;
          case '\x0f':
            pcVar7 = "or";
            break;
          case '\x10':
            pcVar7 = "nor";
            break;
          case '\x11':
            pcVar7 = "xor";
            break;
          case '\x12':
            pcVar7 = "xnor";
            break;
          case '\x15':
            pcVar7 = "mux";
            break;
          default:
            if (cVar2 != 'N') goto switchD_0039350c_caseD_a;
            pcVar7 = "_DC";
          }
          fprintf(__stream,"  %s (",pcVar7);
          uVar10 = (ulong)(p->vObjName).nSize;
          if ((long)uVar10 < 1) {
LAB_0039382e:
            __assert_fail("Acb_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                          ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
          }
          if (uVar10 <= uVar8) goto LAB_0039380f;
          pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar8]);
          fprintf(__stream," %s",pcVar7);
          if ((long)(p->vObjFans).nSize <= (long)uVar8) goto LAB_0039380f;
          iVar3 = (p->vObjFans).pArray[uVar8];
          lVar13 = (long)iVar3;
          if ((lVar13 < 0) || ((p->vFanSto).nSize <= iVar3)) goto LAB_0039388b;
          piVar5 = (p->vFanSto).pArray;
          if (0 < piVar5[lVar13]) {
            lVar11 = 0;
            do {
              iVar3 = piVar5[lVar13 + lVar11 + 1];
              if ((long)iVar3 < 1) goto LAB_0039384d;
              iVar4 = (p->vObjName).nSize;
              if (iVar4 < 1) goto LAB_0039382e;
              if (iVar4 <= iVar3) goto LAB_0039380f;
              lVar11 = lVar11 + 1;
              pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar3]);
              fprintf(__stream,", %s",pcVar7);
            } while (lVar11 < piVar5[lVar13]);
          }
          fwrite(" );",3,1,__stream);
          uVar10 = (ulong)(p->vObjWeight).nSize;
          if (0 < (long)uVar10) {
            if (uVar10 <= uVar8) goto LAB_0039380f;
            if (0 < (p->vObjWeight).pArray[uVar8]) {
              lVar13 = ftell(__stream);
              uVar10 = (ulong)(p->vObjWeight).nSize;
              if ((long)uVar10 < 1) {
                __assert_fail("Acb_NtkHasObjWeights(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                              ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
              }
              if (uVar10 <= uVar8) goto LAB_0039380f;
              fprintf(__stream," %*s // weight = %d",(ulong)(((int)lVar12 - (int)lVar13) + 0x37),"",
                      (ulong)(uint)(p->vObjWeight).pArray[uVar8]);
            }
          }
          fputc(10,__stream);
        }
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)(p->vObjType).nSize);
  }
  fwrite("\nendmodule\n\n",0xc,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Acb_VerilogSimpleWrite( Acb_Ntk_t * p, char * pFileName )
{
    int i, iObj, fFirst = 1;
    FILE * pFile = fopen( pFileName, "wb" ); 
    if ( pFile == NULL ) { printf( "Cannot open file \"%s\" for writing.\n", pFileName ); return; }

    fprintf( pFile, "\nmodule %s (\n  ", Acb_NtkName(p) );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "%s, ", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n  " );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "%s%s", fFirst ? "":", ", Acb_ObjNameStr(p, iObj) ), fFirst = 0;
    fprintf( pFile, "\n);\n\n" );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "  input %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "  output %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
            fprintf( pFile, "  wire %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
        {
            int * pFanin, iFanin, k, start = ftell(pFile)+55;
            fprintf( pFile, "  %s (", Acb_Oper2Name( Acb_ObjType(p, iObj) ) );
            fprintf( pFile, " %s", Acb_ObjNameStr(p, iObj) );
            Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
                //if ( iFanin == 0 ) fprintf( pFile, ", <zero>" ); else
                fprintf( pFile, ", %s", Acb_ObjNameStr(p, iFanin) );
            fprintf( pFile, " );" );
            if ( Acb_NtkHasObjWeights(p) && Acb_ObjWeight(p, iObj) > 0 )
                fprintf( pFile, " %*s // weight = %d", (int)(start-ftell(pFile)), "", Acb_ObjWeight(p, iObj) );
            fprintf( pFile, "\n" );
        }
        else // constant nodes
        {
            assert( Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            if ( Acb_ObjType(p, iObj) == ABC_OPER_CONST_X )
                fprintf( pFile, " 1\'bx" );
            else
                fprintf( pFile, " 1\'b%d", Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, " );\n" );
        }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );
}